

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ctype.c
# Opt level: O2

void ctype_preptype(CTRepr *ctr,CType *ct,CTInfo qual,char *t)

{
  char *pcVar1;
  ulong uVar2;
  size_t sVar3;
  
  uVar2 = (ulong)(ct->name).gcptr32;
  if (uVar2 == 0) {
    if (ctr->needsp != 0) {
      pcVar1 = ctr->pb;
      if (ctr->buf < pcVar1) {
        ctr->pb = pcVar1 + -1;
        pcVar1[-1] = ' ';
      }
      else {
        ctr->ok = 0;
      }
    }
    ctype_prepnum(ctr,(uint32_t)((ulong)((long)ct - (long)ctr->cts->tab) >> 4));
    ctr->needsp = 1;
  }
  else {
    ctype_prepstr(ctr,(char *)(uVar2 + 0x10),*(MSize *)(uVar2 + 0xc));
  }
  sVar3 = strlen(t);
  ctype_prepstr(ctr,t,(MSize)sVar3);
  ctype_prepqual(ctr,qual);
  return;
}

Assistant:

static void ctype_preptype(CTRepr *ctr, CType *ct, CTInfo qual, const char *t)
{
  if (gcref(ct->name)) {
    GCstr *str = gco2str(gcref(ct->name));
    ctype_prepstr(ctr, strdata(str), str->len);
  } else {
    if (ctr->needsp) ctype_prepc(ctr, ' ');
    ctype_prepnum(ctr, ctype_typeid(ctr->cts, ct));
    ctr->needsp = 1;
  }
  ctype_prepstr(ctr, t, (MSize)strlen(t));
  ctype_prepqual(ctr, qual);
}